

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxSerialize.cpp
# Opt level: O3

void __thiscall Jinx::Impl::BinaryReader::Read(BinaryReader *this,BufferPtr *val)

{
  undefined8 in_RAX;
  uint32_t size;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->m_pos,&local_24,4);
  Buffer::Reserve((val->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                  (ulong)local_24);
  Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->m_pos,val,(ulong)local_24);
  return;
}

Assistant:

inline_t void BinaryReader::Read(BufferPtr & val)
	{
		uint32_t size;
		m_buffer->Read(&m_pos, &size, sizeof(size));
		val->Reserve(size);
		m_buffer->Read(&m_pos, val, size);
	}